

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adapter.cpp
# Opt level: O1

int8_t msocket_adapter_tcp_data(void *arg,uint8_t *dataBuf,uint32_t dataLen,uint32_t *parseLen)

{
  int8_t iVar1;
  Handler *handler;
  size_t parse_len;
  
  if (arg != (void *)0x0) {
    iVar1 = (**(code **)(*arg + 0x20))(arg,dataBuf,dataLen);
    if (parseLen != (uint32_t *)0x0) {
      *parseLen = 0;
    }
    return iVar1;
  }
  return -1;
}

Assistant:

static int8_t msocket_adapter_tcp_data(void* arg, const uint8_t* dataBuf, uint32_t dataLen, uint32_t* parseLen)
{
   auto handler = reinterpret_cast<msocket::Handler*>(arg);
   if (handler != nullptr)
   {
      std::size_t data_size = static_cast<std::size_t>(dataLen);
      std::size_t parse_len = 0u;
      int result = handler->socket_data_received(dataBuf, data_size, parse_len);
      if (parseLen != nullptr)
      {
         *parseLen = static_cast<std::uint32_t>(parse_len);
      }
      return static_cast<std::int8_t>(result);
   }
   return -1;
}